

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

CommandQueueVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator> *this,
          shared_ptr<VulkanUtilities::VulkanLogicalDevice> *CtorArgs,
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *CtorArgs_1,uint *CtorArgs_2
          ,uint *CtorArgs_3,ImmediateContextCreateInfo *CtorArgs_4)

{
  CommandQueueVkImpl *pCVar1;
  CommandQueueVkImpl *pCVar2;
  shared_ptr<VulkanUtilities::VulkanLogicalDevice> local_88;
  undefined1 local_72;
  uchar local_71;
  shared_ptr<VulkanUtilities::VulkanLogicalDevice> local_70 [2];
  CommandQueueVkImpl *local_50;
  CommandQueueVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  ImmediateContextCreateInfo *CtorArgs_local_4;
  uint *CtorArgs_local_3;
  uint *CtorArgs_local_2;
  IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *CtorArgs_local_1;
  shared_ptr<VulkanUtilities::VulkanLogicalDevice> *CtorArgs_local;
  MakeNewRCObj<Diligent::CommandQueueVkImpl,_Diligent::IMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pObj = (CommandQueueVkImpl *)0x0;
  pNewRefCounters = (RefCountersImpl *)CtorArgs_4;
  CtorArgs_local_4 = (ImmediateContextCreateInfo *)CtorArgs_3;
  CtorArgs_local_3 = CtorArgs_2;
  CtorArgs_local_2 = (uint *)CtorArgs_1;
  CtorArgs_local_1 = (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)CtorArgs;
  CtorArgs_local = (shared_ptr<VulkanUtilities::VulkanLogicalDevice> *)this;
  if (*(long *)(this + 8) == 0) {
    pCVar1 = (CommandQueueVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pCVar1);
    pObj = pCVar1;
    pRefCounters = (IReferenceCounters *)pCVar1;
  }
  else {
    pObj = (CommandQueueVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  local_50 = (CommandQueueVkImpl *)0x0;
  if (*(long *)this == 0) {
    pCVar2 = (CommandQueueVkImpl *)
             RefCountedObject<Diligent::ICommandQueueVk>::operator_new
                       ((RefCountedObject<Diligent::ICommandQueueVk> *)0x1d8,(size_t)CtorArgs);
    pCVar1 = pObj;
    std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>::shared_ptr
              (&local_88,(shared_ptr<VulkanUtilities::VulkanLogicalDevice> *)CtorArgs_local_1);
    CommandQueueVkImpl::CommandQueueVkImpl
              (pCVar2,(IReferenceCounters *)pCVar1,&local_88,
               (SoftwareQueueIndex)(uchar)*CtorArgs_local_2,*CtorArgs_local_3,
               *(Uint32 *)&CtorArgs_local_4->Name,(ImmediateContextCreateInfo *)pNewRefCounters);
    local_50 = pCVar2;
    std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>::~shared_ptr(&local_88);
  }
  else {
    pCVar2 = (CommandQueueVkImpl *)
             new<Diligent::IMemoryAllocator>
                       (0x1d8,*(IMemoryAllocator **)this,*(Char **)(this + 0x10),
                        *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    pCVar1 = pObj;
    local_72 = 1;
    std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>::shared_ptr
              (local_70,(shared_ptr<VulkanUtilities::VulkanLogicalDevice> *)CtorArgs_local_1);
    local_71 = (uchar)*CtorArgs_local_2;
    CommandQueueVkImpl::CommandQueueVkImpl
              (pCVar2,(IReferenceCounters *)pCVar1,local_70,(SoftwareQueueIndex)local_71,
               *CtorArgs_local_3,*(Uint32 *)&CtorArgs_local_4->Name,
               (ImmediateContextCreateInfo *)pNewRefCounters);
    local_72 = 0;
    local_50 = pCVar2;
    std::shared_ptr<VulkanUtilities::VulkanLogicalDevice>::~shared_ptr(local_70);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_50,*(IMemoryAllocator **)this);
  }
  return local_50;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }